

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.h
# Opt level: O2

tuple<bool,_unsigned_long> __thiscall Sexp::Length(Sexp *this)

{
  long lVar1;
  ulong uVar2;
  undefined8 uVar3;
  uint *in_RSI;
  tuple<bool,_unsigned_long> tVar4;
  
  if (*in_RSI == 1) {
    lVar1 = 0;
    uVar2 = 1;
    while ((int)uVar2 == 1) {
      lVar1 = lVar1 + 1;
      in_RSI = *(uint **)(in_RSI + 4);
      uVar2 = (ulong)*in_RSI;
    }
    if ((int)uVar2 == 0) {
      uVar3 = CONCAT71((int7)(uVar2 >> 8),1);
      goto LAB_00113128;
    }
  }
  else {
    lVar1 = 0;
  }
  uVar3 = 0;
LAB_00113128:
  *(long *)this = lVar1;
  (this->field_1).bool_value = SUB81(uVar3,0);
  tVar4.super__Tuple_impl<0UL,_bool,_unsigned_long>._8_8_ = uVar3;
  tVar4.super__Tuple_impl<0UL,_bool,_unsigned_long>.super__Tuple_impl<1UL,_unsigned_long>.
  super__Head_base<1UL,_unsigned_long,_false>._M_head_impl =
       (_Head_base<1UL,_unsigned_long,_false>)(_Head_base<1UL,_unsigned_long,_false>)this;
  return (tuple<bool,_unsigned_long>)tVar4.super__Tuple_impl<0UL,_bool,_unsigned_long>;
}

Assistant:

inline std::tuple<bool, size_t> Length() const {
    if (!IsCons()) {
      // if it's not a list, it has length 0.
      return std::make_tuple(false, 0);
    }

    const Sexp *cursor = this;
    size_t count = 0;
    while (true) {
      if (cursor->IsEmpty()) {
        break;
      }

      if (!cursor->IsCons()) {
        return std::make_tuple(false, count);
      }

      count++;
      cursor = cursor->cons.cdr;
    }

    return std::make_tuple(true, count);
  }